

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O1

char * __thiscall
cmCommandArgumentParserHelper::ExpandVariable(cmCommandArgumentParserHelper *this,char *var)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  _Alloc_hider _Var9;
  char *__s;
  ostringstream ostr;
  allocator local_26c;
  allocator local_26b;
  allocator local_26a;
  allocator local_269;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if (var == (char *)0x0) {
    return (char *)0x0;
  }
  if ((-1 < this->FileLine) && (iVar6 = strcmp(var,"CMAKE_CURRENT_LIST_LINE"), iVar6 == 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::_M_insert<long>((long)local_1a8);
    std::__cxx11::stringbuf::str();
    pcVar8 = AddString(this,&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    return pcVar8;
  }
  pcVar3 = this->Makefile;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_1a8 + 0x10);
  local_1a8._0_8_ = paVar1;
  sVar7 = strlen(var);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,var,var + sVar7);
  pcVar8 = cmMakefile::GetDefinition(pcVar3,(string *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != paVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((pcVar8 != (char *)0x0) || (this->RemoveEmpty != false)) {
    if ((pcVar8 == (char *)0x0) || (this->EscapeQuotes == false)) {
      __s = "";
      if (pcVar8 != (char *)0x0) {
        __s = pcVar8;
      }
      local_1a8._0_8_ = paVar1;
      sVar7 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,__s,__s + sVar7);
      pcVar8 = AddString(this,(string *)local_1a8);
      _Var9._M_p = (pointer)local_1a8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ == paVar1) {
        return pcVar8;
      }
    }
    else {
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      sVar7 = strlen(pcVar8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,pcVar8,pcVar8 + sVar7);
      cmSystemTools::EscapeQuotes((string *)local_1a8,&local_268);
      pcVar8 = AddString(this,(string *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != paVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      local_1a8._16_8_ = local_268.field_2._M_allocated_capacity;
      _Var9._M_p = local_268._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p == &local_268.field_2) {
        return pcVar8;
      }
    }
    operator_delete(_Var9._M_p,local_1a8._16_8_ + 1);
    return pcVar8;
  }
  bVar2 = this->WarnUninitialized;
  if (bVar2 == true) {
    pcVar3 = this->Makefile;
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    sVar7 = strlen(var);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,var,var + sVar7);
    bVar4 = cmMakefile::VariableInitialized(pcVar3,&local_268);
    bVar4 = !bVar4;
  }
  else {
    bVar4 = false;
  }
  if ((bVar2 != false) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2)) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return (char *)0x0;
  }
  bVar2 = this->CheckSystemVars;
  bVar4 = true;
  if (bVar2 == false) {
    std::__cxx11::string::string((string *)&local_1c8,this->FileName,&local_269);
    pcVar8 = cmMakefile::GetHomeDirectory(this->Makefile);
    std::__cxx11::string::string((string *)&local_1e8,pcVar8,&local_26a);
    bVar5 = cmsys::SystemTools::IsSubDirectory(&local_1c8,&local_1e8);
    if (!bVar5) {
      std::__cxx11::string::string((string *)&local_208,this->FileName,&local_26b);
      pcVar8 = cmMakefile::GetHomeOutputDirectory(this->Makefile);
      std::__cxx11::string::string((string *)&local_228,pcVar8,&local_26c);
      bVar4 = cmsys::SystemTools::IsSubDirectory(&local_208,&local_228);
      bVar5 = true;
      goto LAB_0037ed00;
    }
  }
  bVar5 = false;
LAB_0037ed00:
  if (bVar5) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar2 == false) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar4 != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"uninitialized variable \'",0x18);
    sVar7 = strlen(var);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,var,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'",1);
    pcVar3 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return (char *)0x0;
}

Assistant:

char* cmCommandArgumentParserHelper::ExpandVariable(const char* var)
{
  if (!var) {
    return CM_NULLPTR;
  }
  if (this->FileLine >= 0 && strcmp(var, "CMAKE_CURRENT_LIST_LINE") == 0) {
    std::ostringstream ostr;
    ostr << this->FileLine;
    return this->AddString(ostr.str());
  }
  const char* value = this->Makefile->GetDefinition(var);
  if (!value && !this->RemoveEmpty) {
    // check to see if we need to print a warning
    // if strict mode is on and the variable has
    // not been "cleared"/initialized with a set(foo ) call
    if (this->WarnUninitialized && !this->Makefile->VariableInitialized(var)) {
      if (this->CheckSystemVars ||
          cmSystemTools::IsSubDirectory(this->FileName,
                                        this->Makefile->GetHomeDirectory()) ||
          cmSystemTools::IsSubDirectory(
            this->FileName, this->Makefile->GetHomeOutputDirectory())) {
        std::ostringstream msg;
        msg << "uninitialized variable \'" << var << "\'";
        this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, msg.str());
      }
    }
    return CM_NULLPTR;
  }
  if (this->EscapeQuotes && value) {
    return this->AddString(cmSystemTools::EscapeQuotes(value));
  }
  return this->AddString(value ? value : "");
}